

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O3

int Ver_ParseConstant(Ver_Man_t *pMan,char *pWord)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  Vec_Ptr_t *pVVar4;
  uint uVar5;
  void **ppvVar6;
  char cVar7;
  void *pvVar8;
  ulong uVar9;
  int *piVar10;
  char *pcVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  
  cVar7 = *pWord;
  if ((cVar7 < '1') || ('9' < pWord[1])) {
    __assert_fail("pWord[0] >= \'1\' && pWord[1] <= \'9\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/ver/verCore.c"
                  ,0x2f4,"int Ver_ParseConstant(Ver_Man_t *, char *)");
  }
  uVar5 = atoi(pWord);
  pcVar11 = pWord + 1;
  while (cVar7 != '\0') {
    if (cVar7 == '\'') {
      if (*pcVar11 != 'b') {
        builtin_strncpy(pMan->sError + 0x10,"ly handle binary constants.",0x1c);
        uVar12._0_1_ = 'C';
        uVar12._1_1_ = 'u';
        uVar12._2_1_ = 'r';
        uVar12._3_1_ = 'r';
        uVar13._0_1_ = 'e';
        uVar13._1_1_ = 'n';
        uVar13._2_1_ = 't';
        uVar13._3_1_ = 'l';
        uVar14._0_1_ = 'y';
        uVar14._1_1_ = ' ';
        uVar14._2_1_ = 'c';
        uVar14._3_1_ = 'a';
        uVar15._0_1_ = 'n';
        uVar15._1_1_ = ' ';
        uVar15._2_1_ = 'o';
        uVar15._3_1_ = 'n';
        goto LAB_002eb5f4;
      }
      pMan->vNames->nSize = 0;
      if ((int)uVar5 < 1) {
        return 1;
      }
      uVar9 = 0;
      goto LAB_002eb474;
    }
    cVar7 = *pcVar11;
    pcVar11 = pcVar11 + 1;
  }
  builtin_strncpy(pMan->sError,"Cannot find symbol \' in the constant.",0x26);
LAB_002eb5f8:
  Ver_ParsePrintErrorMessage(pMan);
  return 0;
LAB_002eb474:
  bVar1 = pcVar11[uVar9 + 1];
  if (bVar1 - 0x30 < 2) {
    pVVar4 = pMan->vNames;
    pvVar8 = (void *)((ulong)bVar1 - 0x30);
    piVar10 = &pVVar4->nSize;
    uVar2 = pVVar4->nSize;
    if (uVar2 == pVVar4->nCap) {
      if ((int)uVar2 < 0x10) {
        if (pVVar4->pArray == (void **)0x0) {
          ppvVar6 = (void **)malloc(0x80);
        }
        else {
          ppvVar6 = (void **)realloc(pVVar4->pArray,0x80);
        }
        pVVar4->pArray = ppvVar6;
        pVVar4->nCap = 0x10;
      }
      else {
        if (pVVar4->pArray == (void **)0x0) {
          ppvVar6 = (void **)malloc((ulong)uVar2 << 4);
        }
        else {
          ppvVar6 = (void **)realloc(pVVar4->pArray,(ulong)uVar2 << 4);
        }
        pVVar4->pArray = ppvVar6;
        pVVar4->nCap = uVar2 * 2;
      }
    }
    else {
      ppvVar6 = pVVar4->pArray;
    }
  }
  else {
    if (bVar1 != 0x78) {
      builtin_strncpy(pMan->sError + 0x10,"arsing the binary constant.",0x1c);
      uVar12._0_1_ = 'H';
      uVar12._1_1_ = 'a';
      uVar12._2_1_ = 'v';
      uVar12._3_1_ = 'i';
      uVar13._0_1_ = 'n';
      uVar13._1_1_ = 'g';
      uVar13._2_1_ = ' ';
      uVar13._3_1_ = 'p';
      uVar14._0_1_ = 'r';
      uVar14._1_1_ = 'o';
      uVar14._2_1_ = 'b';
      uVar14._3_1_ = 'l';
      uVar15._0_1_ = 'e';
      uVar15._1_1_ = 'm';
      uVar15._2_1_ = ' ';
      uVar15._3_1_ = 'p';
LAB_002eb5f4:
      *(undefined4 *)pMan->sError = uVar12;
      *(undefined4 *)(pMan->sError + 4) = uVar13;
      *(undefined4 *)(pMan->sError + 8) = uVar14;
      *(undefined4 *)(pMan->sError + 0xc) = uVar15;
      goto LAB_002eb5f8;
    }
    pVVar4 = pMan->vNames;
    piVar10 = &pVVar4->nSize;
    uVar2 = pVVar4->nSize;
    if (uVar2 == pVVar4->nCap) {
      if ((int)uVar2 < 0x10) {
        if (pVVar4->pArray == (void **)0x0) {
          ppvVar6 = (void **)malloc(0x80);
        }
        else {
          ppvVar6 = (void **)realloc(pVVar4->pArray,0x80);
        }
        pVVar4->pArray = ppvVar6;
        pVVar4->nCap = 0x10;
      }
      else {
        if (pVVar4->pArray == (void **)0x0) {
          ppvVar6 = (void **)malloc((ulong)uVar2 << 4);
        }
        else {
          ppvVar6 = (void **)realloc(pVVar4->pArray,(ulong)uVar2 << 4);
        }
        pVVar4->pArray = ppvVar6;
        pVVar4->nCap = uVar2 * 2;
      }
      pvVar8 = (void *)0x0;
    }
    else {
      ppvVar6 = pVVar4->pArray;
      pvVar8 = (void *)0x0;
    }
  }
  iVar3 = *piVar10;
  *piVar10 = iVar3 + 1;
  ppvVar6[iVar3] = pvVar8;
  uVar9 = uVar9 + 1;
  if (uVar5 == uVar9) {
    return 1;
  }
  goto LAB_002eb474;
}

Assistant:

int Ver_ParseConstant( Ver_Man_t * pMan, char * pWord )
{
    int nBits, i;
    assert( pWord[0] >= '1' && pWord[1] <= '9' );
    nBits = atoi(pWord);
    // find the next symbol \'
    while ( *pWord && *pWord != '\'' )
        pWord++;
    if ( *pWord == 0 )
    {
        sprintf( pMan->sError, "Cannot find symbol \' in the constant." );
        Ver_ParsePrintErrorMessage( pMan );
        return 0;
    }
    assert( *pWord == '\'' );
    pWord++;
    if ( *pWord != 'b' )
    {
        sprintf( pMan->sError, "Currently can only handle binary constants." );
        Ver_ParsePrintErrorMessage( pMan );
        return 0;
    }
    pWord++;
    // scan the bits
    Vec_PtrClear( pMan->vNames );
    for ( i = 0; i < nBits; i++ )
    {
      if ( pWord[i] != '0' && pWord[i] != '1' && pWord[i] != 'x' )
      {
         sprintf( pMan->sError, "Having problem parsing the binary constant." );
         Ver_ParsePrintErrorMessage( pMan );
         return 0;
      }
      if ( pWord[i] == 'x' ) 
          Vec_PtrPush( pMan->vNames, (void *)0 );
      else 
          Vec_PtrPush( pMan->vNames, (void *)(ABC_PTRUINT_T)(pWord[i]-'0') );
    }
    return 1;
}